

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int parse_esni_keys(ptls_context_t *ctx,uint16_t *esni_version,
                   ptls_key_exchange_algorithm_t **selected_key_share,
                   ptls_cipher_suite_t **selected_cipher,ptls_iovec_t *peer_key,
                   uint16_t *padded_length,char **published_sni,ptls_iovec_t input)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  uint8_t *puVar4;
  uint8_t *end_5;
  uint8_t *_src_4;
  uint64_t _block_size64_4;
  size_t _block_size_4;
  size_t _capacity_4;
  uint8_t *puStack_140;
  uint16_t id;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  size_t len;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  uint8_t digest [32];
  ptls_hash_context_t *hctx;
  int ret;
  uint64_t now;
  uint64_t not_after;
  uint64_t not_before;
  uint8_t *puStack_48;
  uint16_t version;
  uint8_t *end;
  uint8_t *src;
  uint16_t *padded_length_local;
  ptls_iovec_t *peer_key_local;
  ptls_cipher_suite_t **selected_cipher_local;
  ptls_key_exchange_algorithm_t **selected_key_share_local;
  uint16_t *esni_version_local;
  ptls_context_t *ctx_local;
  
  end = input.base;
  puStack_48 = input.base + input.len;
  src = (uint8_t *)padded_length;
  padded_length_local = (uint16_t *)peer_key;
  peer_key_local = (ptls_iovec_t *)selected_cipher;
  selected_cipher_local = (ptls_cipher_suite_t **)selected_key_share;
  selected_key_share_local = (ptls_key_exchange_algorithm_t **)esni_version;
  esni_version_local = (uint16_t *)ctx;
  hctx._4_4_ = ptls_decode16((uint16_t *)((long)&not_before + 6),&end,puStack_48);
  if (hctx._4_4_ == 0) {
    if (not_before._6_2_ == -0xfe) {
      if ((long)puStack_48 - (long)end < 4) {
        hctx._4_4_ = 0x32;
      }
      else {
        digest._24_8_ = create_sha256_context((ptls_context_t *)esni_version_local);
        if ((ptls_hash_context_t *)digest._24_8_ == (ptls_hash_context_t *)0x0) {
          hctx._4_4_ = 0x203;
        }
        else {
          (*((ptls_hash_context_t *)digest._24_8_)->update)
                    ((st_ptls_hash_context_t *)digest._24_8_,input.base,(long)end - (long)input.base
                    );
          (**(code **)digest._24_8_)(digest._24_8_,"",4);
          (**(code **)digest._24_8_)(digest._24_8_,end + 4,(long)puStack_48 - (long)(end + 4));
          (**(code **)(digest._24_8_ + 8))(digest._24_8_,&_capacity,0);
          if (*(int *)end == (int)_capacity) {
            *(short *)selected_key_share_local = not_before._6_2_;
            _block_size = 2;
            if ((ulong)((long)puStack_48 - (long)(end + 4)) < 2) {
              hctx._4_4_ = 0x32;
            }
            else {
              _block_size64 = 0;
              end = end + 4;
              do {
                puVar4 = end + 1;
                _block_size64 = _block_size64 << 8 | (ulong)*end;
                _block_size = _block_size - 1;
                end = puVar4;
              } while (_block_size != 0);
              if ((ulong)((long)puStack_48 - (long)puVar4) < _block_size64) {
                hctx._4_4_ = 0x32;
              }
              else {
                len = (size_t)(puVar4 + _block_size64);
                _capacity_1 = len - (long)puVar4;
                pcVar2 = (char *)malloc(_capacity_1 + 1);
                *published_sni = pcVar2;
                if (*published_sni == (char *)0x0) {
                  hctx._4_4_ = 0x201;
                }
                else {
                  if (_capacity_1 != 0) {
                    memcpy(*published_sni,end,_capacity_1);
                  }
                  (*published_sni)[_capacity_1] = '\0';
                  end = (uint8_t *)len;
                  _block_size_1 = 2;
                  if ((long)puStack_48 - len < 2) {
                    hctx._4_4_ = 0x32;
                  }
                  else {
                    _block_size64_1 = 0;
                    do {
                      puVar4 = end + 1;
                      _block_size64_1 = _block_size64_1 << 8 | (ulong)*end;
                      _block_size_1 = _block_size_1 - 1;
                      end = puVar4;
                    } while (_block_size_1 != 0);
                    if ((ulong)((long)puStack_48 - (long)puVar4) < _block_size64_1) {
                      hctx._4_4_ = 0x32;
                    }
                    else {
                      _capacity_2 = (size_t)(puVar4 + _block_size64_1);
                      hctx._4_4_ = select_key_share((ptls_key_exchange_algorithm_t **)
                                                    selected_cipher_local,
                                                    (ptls_iovec_t *)padded_length_local,
                                                    *(ptls_key_exchange_algorithm_t ***)
                                                     (esni_version_local + 8),&end,
                                                    (uint8_t *)_capacity_2,0);
                      if (hctx._4_4_ == 0) {
                        if (end == (uint8_t *)_capacity_2) {
                          _block_size_2 = 2;
                          if ((ulong)((long)puStack_48 - (long)end) < 2) {
                            hctx._4_4_ = 0x32;
                          }
                          else {
                            _block_size64_2 = 0;
                            do {
                              puVar4 = end + 1;
                              _block_size64_2 = _block_size64_2 << 8 | (ulong)*end;
                              _block_size_2 = _block_size_2 - 1;
                              end = puVar4;
                            } while (_block_size_2 != 0);
                            if ((ulong)((long)puStack_48 - (long)puVar4) < _block_size64_2) {
                              hctx._4_4_ = 0x32;
                            }
                            else {
                              _capacity_3 = (size_t)(puVar4 + _block_size64_2);
                              hctx._4_4_ = select_cipher((ptls_cipher_suite_t **)peer_key_local,
                                                         *(ptls_cipher_suite_t ***)
                                                          (esni_version_local + 0xc),puVar4,
                                                         (uint8_t *)_capacity_3);
                              if (hctx._4_4_ == 0) {
                                end = (uint8_t *)_capacity_3;
                                hctx._4_4_ = ptls_decode16((uint16_t *)src,&end,puStack_48);
                                if ((((hctx._4_4_ == 0) && (src != (uint8_t *)0x0)) &&
                                    (hctx._4_4_ = ptls_decode64(&not_after,&end,puStack_48),
                                    hctx._4_4_ == 0)) &&
                                   (hctx._4_4_ = ptls_decode64(&now,&end,puStack_48),
                                   hctx._4_4_ == 0)) {
                                  _block_size_3 = 2;
                                  if ((ulong)((long)puStack_48 - (long)end) < 2) {
                                    hctx._4_4_ = 0x32;
                                  }
                                  else {
                                    _block_size64_3 = 0;
                                    do {
                                      puStack_140 = end + 1;
                                      _block_size64_3 = _block_size64_3 << 8 | (ulong)*end;
                                      _block_size_3 = _block_size_3 - 1;
                                      end = puStack_140;
                                    } while (_block_size_3 != 0);
                                    if ((ulong)((long)puStack_48 - (long)puStack_140) <
                                        _block_size64_3) {
                                      hctx._4_4_ = 0x32;
                                    }
                                    else {
                                      puStack_140 = puStack_140 + _block_size64_3;
                                      _block_size_3 = 0;
                                      while (end != puStack_140) {
                                        iVar1 = ptls_decode16((uint16_t *)((long)&_capacity_4 + 6),
                                                              &end,puStack_140);
                                        if (iVar1 != 0) {
                                          return iVar1;
                                        }
                                        _block_size_4 = 2;
                                        if ((ulong)((long)puStack_140 - (long)end) < 2) {
                                          return 0x32;
                                        }
                                        _block_size64_4 = 0;
                                        do {
                                          puVar4 = end + 1;
                                          _block_size64_4 = _block_size64_4 << 8 | (ulong)*end;
                                          _block_size_4 = _block_size_4 - 1;
                                          end = puVar4;
                                        } while (_block_size_4 != 0);
                                        if ((ulong)((long)puStack_140 - (long)puVar4) <
                                            _block_size64_4) {
                                          return 0x32;
                                        }
                                        end = puVar4 + _block_size64_4;
                                      }
                                      if (end == puStack_140) {
                                        if (end == puStack_48) {
                                          uVar3 = (*(code *)**(undefined8 **)
                                                              (esni_version_local + 4))
                                                            (*(undefined8 *)(esni_version_local + 4)
                                                            );
                                          if ((not_after * 1000 < uVar3 ||
                                               not_after * 1000 - uVar3 == 0) &&
                                             (uVar3 <= now * 1000)) {
                                            hctx._4_4_ = 0;
                                          }
                                          else {
                                            hctx._4_4_ = 0x32;
                                          }
                                        }
                                        else {
                                          hctx._4_4_ = 0x32;
                                        }
                                      }
                                      else {
                                        hctx._4_4_ = 0x32;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        else {
                          hctx._4_4_ = 0x32;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            hctx._4_4_ = 0x32;
          }
        }
      }
    }
    else {
      hctx._4_4_ = 0x32;
    }
  }
  return hctx._4_4_;
}

Assistant:

static int parse_esni_keys(ptls_context_t *ctx, uint16_t *esni_version, ptls_key_exchange_algorithm_t **selected_key_share,
                           ptls_cipher_suite_t **selected_cipher, ptls_iovec_t *peer_key, uint16_t *padded_length,
                           char **published_sni, ptls_iovec_t input)
{
    const uint8_t *src = input.base, *const end = input.base + input.len;
    uint16_t version;
    uint64_t not_before, not_after, now;
    int ret = 0;

    /* version */
    if ((ret = ptls_decode16(&version, &src, end)) != 0)
        goto Exit;
    if (version != PTLS_ESNI_VERSION_DRAFT03) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }

    { /* verify checksum */
        ptls_hash_context_t *hctx;
        uint8_t digest[PTLS_SHA256_DIGEST_SIZE];
        if (end - src < 4) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        if ((hctx = create_sha256_context(ctx)) == NULL) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        hctx->update(hctx, input.base, src - input.base);
        hctx->update(hctx, "\0\0\0\0", 4);
        hctx->update(hctx, src + 4, end - (src + 4));
        hctx->final(hctx, digest, PTLS_HASH_FINAL_MODE_FREE);
        if (memcmp(src, digest, 4) != 0) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        src += 4;
    }
    *esni_version = version;
    /* published sni */
    ptls_decode_open_block(src, end, 2, {
        size_t len = end - src;
        *published_sni = malloc(len + 1);
        if (*published_sni == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if (len > 0) {
            memcpy(*published_sni, src, len);
        }
        (*published_sni)[len] = 0;
        src = end;
    });
    /* key-shares */
    ptls_decode_open_block(src, end, 2, {
        if ((ret = select_key_share(selected_key_share, peer_key, ctx->key_exchanges, &src, end, 0)) != 0)
            goto Exit;
    });
    /* cipher-suite */
    ptls_decode_open_block(src, end, 2, {
        if ((ret = select_cipher(selected_cipher, ctx->cipher_suites, src, end)) != 0)
            goto Exit;
        src = end;
    });
    /* padded-length */
    if ((ret = ptls_decode16(padded_length, &src, end)) != 0)
        goto Exit;
    if (padded_length == 0)
        goto Exit;
    /* not-before, not_after */
    if ((ret = ptls_decode64(&not_before, &src, end)) != 0 || (ret = ptls_decode64(&not_after, &src, end)) != 0)
        goto Exit;
    /* extensions */
    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
        }
    });

    /* check validity period */
    now = ctx->get_time->cb(ctx->get_time);
    if (!(not_before * 1000 <= now && now <= not_after * 1000)) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }

    ret = 0;
Exit:
    return ret;
}